

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdx86_decoder.c
# Opt level: O0

NDSTATUS NdGetAddrAndOpMode(INSTRUX *Instrux)

{
  byte bVar1;
  uint uVar2;
  uint local_20;
  INSTRUX *Instrux_local;
  
  uVar2 = *(uint *)Instrux & 3;
  if (uVar2 == 0) {
    *(uint *)Instrux =
         *(uint *)Instrux & 0xffffff3f | (uint)((*(uint *)&Instrux->field_0x5 >> 6 & 1) != 0) << 6;
    *(uint *)Instrux =
         *(uint *)Instrux & 0xfffffcff | (uint)((*(uint *)&Instrux->field_0x5 >> 5 & 1) != 0) << 8;
  }
  else if (uVar2 == 1) {
    *(uint *)Instrux =
         *(uint *)Instrux & 0xffffff3f | (uint)((*(uint *)&Instrux->field_0x5 >> 6 & 1) == 0) << 6;
    *(uint *)Instrux =
         *(uint *)Instrux & 0xfffffcff | (uint)((*(uint *)&Instrux->field_0x5 >> 5 & 1) == 0) << 8;
  }
  else {
    if (uVar2 != 2) {
      return 0x80000101;
    }
    bVar1 = 2;
    if ((*(uint *)&Instrux->field_0x5 >> 6 & 1) != 0) {
      bVar1 = 1;
    }
    *(uint *)Instrux = *(uint *)Instrux & 0xffffff3f | (uint)bVar1 << 6;
    if (((uint)Instrux->Exs & 1) == 0) {
      local_20 = (uint)((*(uint *)&Instrux->field_0x5 >> 5 & 1) == 0);
    }
    else {
      local_20 = 2;
    }
    *(uint *)Instrux = *(uint *)Instrux & 0xfffffcff | local_20 << 8;
  }
  return 0;
}

Assistant:

static NDSTATUS
NdGetAddrAndOpMode(
    INSTRUX *Instrux
    )
{
    // Fill in addressing mode & default op size.
    switch (Instrux->DefCode)
    {
    case ND_CODE_16:
        Instrux->AddrMode = Instrux->HasAddrSize ? ND_ADDR_32 : ND_ADDR_16;
        Instrux->OpMode = Instrux->HasOpSize ? ND_OPSZ_32 : ND_OPSZ_16;
        break;
    case ND_CODE_32:
        Instrux->AddrMode = Instrux->HasAddrSize ? ND_ADDR_16 : ND_ADDR_32;
        Instrux->OpMode = Instrux->HasOpSize ? ND_OPSZ_16 : ND_OPSZ_32;
        break;
    case ND_CODE_64:
        Instrux->AddrMode = Instrux->HasAddrSize ? ND_ADDR_32 : ND_ADDR_64;
        Instrux->OpMode = Instrux->Exs.w ? ND_OPSZ_64 : (Instrux->HasOpSize ? ND_OPSZ_16 : ND_OPSZ_32);
        break;
    default:
        return ND_STATUS_INVALID_INSTRUX;
    }

    return ND_STATUS_SUCCESS;
}